

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void CManager_free(CManager_conflict cm)

{
  FILE *__stream;
  __pid_t _Var1;
  pthread_t pVar2;
  ulong uVar3;
  undefined8 *in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  CMbuffer next;
  CMbuffer list;
  int i;
  __time_t local_30;
  undefined4 local_28;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  long lVar4;
  long lVar5;
  attr_list l;
  long lVar6;
  undefined4 in_stack_fffffffffffffff0;
  int iVar7;
  uint uVar8;
  
  l = (attr_list)0x0;
  INT_CMfree((void *)0x11b8cf);
  *in_RDI = 0;
  in_RDI[0x16] = 0;
  INT_CMfree((void *)0x11b8f9);
  for (iVar7 = 0; iVar7 < *(int *)(in_RDI + 7); iVar7 = iVar7 + 1) {
    INT_CMfree((void *)0x11b92a);
    INT_CMfree((void *)0x11b941);
  }
  INT_CMfree((void *)0x11b95c);
  INT_CMfree((void *)0x11b96a);
  INT_CMfree((void *)0x11b978);
  INT_CMfree((void *)0x11b986);
  pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 0xf));
  pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 0x18));
  if (in_RDI[0x1f] != 0) {
    iVar7 = 0;
    while (*(long *)(in_RDI[0x1f] + (long)iVar7 * 8) != 0) {
      CMint_free_attr_list
                ((CManager)CONCAT44(iVar7,in_stack_fffffffffffffff0),l,in_stack_ffffffffffffffe0,
                 in_stack_ffffffffffffffdc);
      iVar7 = iVar7 + 1;
    }
    INT_CMfree((void *)0x11ba1d);
  }
  lVar5 = in_RDI[0x1d];
  uVar8 = 0;
  while (lVar5 != 0) {
    lVar4 = *(long *)(lVar5 + 0x18);
    lVar6 = lVar5;
    iVar7 = CMtrace_val[9];
    if (in_RDI[0x24] == 0) {
      iVar7 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
      lVar6 = lVar5;
    }
    lVar5 = lVar4;
    if (iVar7 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)in_RDI[0x24];
        _Var1 = getpid();
        pVar2 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var1,pVar2);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_30);
        fprintf((FILE *)in_RDI[0x24],"%lld.%.9ld - ",local_30,
                CONCAT44(in_stack_ffffffffffffffdc,local_28));
      }
      uVar3 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
      fprintf((FILE *)in_RDI[0x24],"Final buffer disposition buf %d, %p, size %zd, ref_count %d\n",
              uVar3,lVar6,*(undefined8 *)(lVar6 + 8),(ulong)*(uint *)(lVar6 + 0x10));
    }
    fflush((FILE *)in_RDI[0x24]);
    if (*(long *)(lVar6 + 0x20) == 0) {
      INT_CMfree((void *)0x11bb9b);
    }
    else {
      (**(code **)(lVar6 + 0x20))(*(undefined8 *)(lVar6 + 0x28));
    }
    INT_CMfree((void *)0x11bba5);
  }
  in_RDI[0x1d] = 0;
  if (in_RDI[0x20] != 0) {
    INT_CMfree((void *)0x11bbe4);
  }
  INT_CMfree((void *)0x11bbf5);
  INT_CMfree((void *)0x11bbff);
  return;
}

Assistant:

static void
CManager_free(CManager cm)
{
    int i;
    CMbuffer list = NULL;

    INT_CMfree(cm->transports);
    cm->transports = NULL;
/*    free_FFSContext(cm->FFScontext);*/
    cm->FFScontext = NULL;
    INT_CMfree(cm->in_formats);

    for (i=0 ; i < cm->reg_format_count; i++) {
	INT_CMfree(cm->reg_formats[i]->format_name);
	INT_CMfree(cm->reg_formats[i]);
    }
    INT_CMfree(cm->reg_formats);

    /*
     *  Applications are expected to free the user contexts that 
     *  they request.  If they do this, there will be no user formats to
     *  free at this point.  (Doing so might result in double freeing.)
     */
    INT_CMfree(cm->reg_user_formats);

    INT_CMfree(cm->pbio_requests);

    INT_CMfree(cm->connections);

    thr_mutex_free(cm->exchange_lock);

    thr_mutex_free(cm->context_lock);

    if (cm->contact_lists != NULL) {
	i = 0;
	while(cm->contact_lists[i] != NULL) {
	    INT_CMfree_attr_list(cm, cm->contact_lists[i]);
	    i++;
	}
	INT_CMfree(cm->contact_lists);
    }
    list = cm->cm_buffer_list;
    i=0;
    while (list != NULL) {
	CMbuffer next = list->next;
	CMtrace_out(cm, CMBufferVerbose, "Final buffer disposition buf %d, %p, size %zd, ref_count %d\n", i++, list, list->size, list->ref_count);
	if (list->return_callback) {
	    (list->return_callback)(list->return_callback_data);
	} else {
	    INT_CMfree(list->buffer);
	}
	INT_CMfree(list);
	list = next;
    }
    cm->cm_buffer_list = NULL;
    if (cm->shutdown_functions) INT_CMfree(cm->shutdown_functions);
    INT_CMfree(cm->avail);
     INT_CMfree(cm);
 }